

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3EvalSelectDeferred(Fts3Cursor *pCsr,Fts3Expr *pRoot,Fts3TokenAndCost *aTC,int nTC)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  int nCount;
  Fts3PhraseToken *pToken_1;
  Fts3PhraseToken *pToken;
  Fts3TokenAndCost *pTC;
  int iTC;
  int nLoad4;
  int nMinEst;
  int nToken;
  int nOvfl;
  int ii;
  int rc;
  Fts3Table *pTab;
  char *pList;
  int nList;
  int nDocSize;
  uint in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  char **ppOut;
  int *in_stack_ffffffffffffff88;
  int *in_stack_ffffffffffffff90;
  Fts3Phrase *p;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar4;
  int iVar5;
  int iCol;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_1c;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_54 = 0;
  local_58 = 0;
  iCol = 0;
  iVar5 = 1;
  if (*(long *)(*in_RDI + 0x50) == 0) {
    for (local_50 = 0; local_50 < in_ECX; local_50 = local_50 + 1) {
      if (*(long *)(in_RDX + (long)local_50 * 0x28 + 0x18) == in_RSI) {
        local_54 = *(int *)(in_RDX + (long)local_50 * 0x28 + 0x20) + local_54;
        local_58 = local_58 + 1;
      }
    }
    if ((local_54 == 0) || (local_58 < 2)) {
      local_1c = 0;
    }
    else {
      local_4c = fts3EvalAverageDocsize
                           ((Fts3Cursor *)
                            CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                            in_stack_ffffffffffffff90);
      local_50 = 0;
      while( true ) {
        uVar3 = in_stack_ffffffffffffff78 & 0xffffff;
        if (local_50 < local_58) {
          uVar3 = CONCAT13(local_4c == 0,(int3)in_stack_ffffffffffffff78);
        }
        in_stack_ffffffffffffff78 = uVar3;
        if ((char)(in_stack_ffffffffffffff78 >> 0x18) == '\0') break;
        p = (Fts3Phrase *)0x0;
        for (iVar4 = 0; iVar4 < in_ECX; iVar4 = iVar4 + 1) {
          if (((*(long *)(in_RDX + (long)iVar4 * 0x28 + 0x10) != 0) &&
              (*(long *)(in_RDX + (long)iVar4 * 0x28 + 0x18) == in_RSI)) &&
             ((p == (Fts3Phrase *)0x0 ||
              (*(int *)(in_RDX + (long)iVar4 * 0x28 + 0x20) < (p->doclist).bFreeList)))) {
            p = (Fts3Phrase *)(in_RDX + (long)iVar4 * 0x28);
          }
        }
        if (local_50 == 0) {
LAB_0024d7b5:
          if (local_50 < 0xc) {
            iVar5 = iVar5 << 2;
          }
          if ((local_50 == 0) ||
             ((1 < *(int *)((p->doclist).aAll + 0x50) && (local_50 != local_58 + -1)))) {
            ppOut = (char **)(p->doclist).pNextDocid;
            local_4c = fts3TermSelect((Fts3Table *)CONCAT44(iCol,iVar5),
                                      (Fts3PhraseToken *)CONCAT44(iVar4,in_stack_ffffffffffffff98),
                                      (int)((ulong)p >> 0x20),in_stack_ffffffffffffff88,ppOut);
            if (local_4c == 0) {
              local_4c = fts3EvalPhraseMergeToken
                                   ((Fts3Table *)CONCAT44(iVar4,in_stack_ffffffffffffff98),p,
                                    (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(char *)ppOut,
                                    in_stack_ffffffffffffff7c);
            }
            if ((local_4c == 0) &&
               ((in_stack_ffffffffffffff7c = fts3DoclistCountDocids((char *)ppOut,-0x55555556),
                local_50 == 0 || (in_stack_ffffffffffffff7c < iCol)))) {
              iCol = in_stack_ffffffffffffff7c;
            }
          }
        }
        else {
          iVar1 = (p->doclist).bFreeList;
          if (iVar1 < 0) goto LAB_0024d7b5;
          in_stack_ffffffffffffff88 = (int *)(p->doclist).pNextDocid;
          local_4c = sqlite3Fts3DeferToken
                               ((Fts3Cursor *)
                                CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                                (Fts3PhraseToken *)CONCAT44(iVar1,iCol + iVar5 / 4 + -1),iCol);
          fts3SegReaderCursorFree((Fts3MultiSegReader *)0x24d7a3);
          in_stack_ffffffffffffff88[8] = 0;
          in_stack_ffffffffffffff88[9] = 0;
        }
        (p->doclist).pNextDocid = (char *)0x0;
        local_50 = local_50 + 1;
      }
      local_1c = local_4c;
    }
  }
  else {
    local_1c = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return local_1c;
}

Assistant:

static int fts3EvalSelectDeferred(
  Fts3Cursor *pCsr,               /* FTS Cursor handle */
  Fts3Expr *pRoot,                /* Consider tokens with this root node */
  Fts3TokenAndCost *aTC,          /* Array of expression tokens and costs */
  int nTC                         /* Number of entries in aTC[] */
){
  Fts3Table *pTab = (Fts3Table *)pCsr->base.pVtab;
  int nDocSize = 0;               /* Number of pages per doc loaded */
  int rc = SQLITE_OK;             /* Return code */
  int ii;                         /* Iterator variable for various purposes */
  int nOvfl = 0;                  /* Total overflow pages used by doclists */
  int nToken = 0;                 /* Total number of tokens in cluster */

  int nMinEst = 0;                /* The minimum count for any phrase so far. */
  int nLoad4 = 1;                 /* (Phrases that will be loaded)^4. */

  /* Tokens are never deferred for FTS tables created using the content=xxx
  ** option. The reason being that it is not guaranteed that the content
  ** table actually contains the same data as the index. To prevent this from
  ** causing any problems, the deferred token optimization is completely
  ** disabled for content=xxx tables. */
  if( pTab->zContentTbl ){
    return SQLITE_OK;
  }

  /* Count the tokens in this AND/NEAR cluster. If none of the doclists
  ** associated with the tokens spill onto overflow pages, or if there is
  ** only 1 token, exit early. No tokens to defer in this case. */
  for(ii=0; ii<nTC; ii++){
    if( aTC[ii].pRoot==pRoot ){
      nOvfl += aTC[ii].nOvfl;
      nToken++;
    }
  }
  if( nOvfl==0 || nToken<2 ) return SQLITE_OK;

  /* Obtain the average docsize (in pages). */
  rc = fts3EvalAverageDocsize(pCsr, &nDocSize);
  assert( rc!=SQLITE_OK || nDocSize>0 );


  /* Iterate through all tokens in this AND/NEAR cluster, in ascending order
  ** of the number of overflow pages that will be loaded by the pager layer
  ** to retrieve the entire doclist for the token from the full-text index.
  ** Load the doclists for tokens that are either:
  **
  **   a. The cheapest token in the entire query (i.e. the one visited by the
  **      first iteration of this loop), or
  **
  **   b. Part of a multi-token phrase.
  **
  ** After each token doclist is loaded, merge it with the others from the
  ** same phrase and count the number of documents that the merged doclist
  ** contains. Set variable "nMinEst" to the smallest number of documents in
  ** any phrase doclist for which 1 or more token doclists have been loaded.
  ** Let nOther be the number of other phrases for which it is certain that
  ** one or more tokens will not be deferred.
  **
  ** Then, for each token, defer it if loading the doclist would result in
  ** loading N or more overflow pages into memory, where N is computed as:
  **
  **    (nMinEst + 4^nOther - 1) / (4^nOther)
  */
  for(ii=0; ii<nToken && rc==SQLITE_OK; ii++){
    int iTC;                      /* Used to iterate through aTC[] array. */
    Fts3TokenAndCost *pTC = 0;    /* Set to cheapest remaining token. */

    /* Set pTC to point to the cheapest remaining token. */
    for(iTC=0; iTC<nTC; iTC++){
      if( aTC[iTC].pToken && aTC[iTC].pRoot==pRoot
       && (!pTC || aTC[iTC].nOvfl<pTC->nOvfl)
      ){
        pTC = &aTC[iTC];
      }
    }
    assert( pTC );

    if( ii && pTC->nOvfl>=((nMinEst+(nLoad4/4)-1)/(nLoad4/4))*nDocSize ){
      /* The number of overflow pages to load for this (and therefore all
      ** subsequent) tokens is greater than the estimated number of pages
      ** that will be loaded if all subsequent tokens are deferred.
      */
      Fts3PhraseToken *pToken = pTC->pToken;
      rc = sqlite3Fts3DeferToken(pCsr, pToken, pTC->iCol);
      fts3SegReaderCursorFree(pToken->pSegcsr);
      pToken->pSegcsr = 0;
    }else{
      /* Set nLoad4 to the value of (4^nOther) for the next iteration of the
      ** for-loop. Except, limit the value to 2^24 to prevent it from
      ** overflowing the 32-bit integer it is stored in. */
      if( ii<12 ) nLoad4 = nLoad4*4;

      if( ii==0 || (pTC->pPhrase->nToken>1 && ii!=nToken-1) ){
        /* Either this is the cheapest token in the entire query, or it is
        ** part of a multi-token phrase. Either way, the entire doclist will
        ** (eventually) be loaded into memory. It may as well be now. */
        Fts3PhraseToken *pToken = pTC->pToken;
        int nList = 0;
        char *pList = 0;
        rc = fts3TermSelect(pTab, pToken, pTC->iCol, &nList, &pList);
        assert( rc==SQLITE_OK || pList==0 );
        if( rc==SQLITE_OK ){
          rc = fts3EvalPhraseMergeToken(
              pTab, pTC->pPhrase, pTC->iToken,pList,nList
          );
        }
        if( rc==SQLITE_OK ){
          int nCount;
          nCount = fts3DoclistCountDocids(
              pTC->pPhrase->doclist.aAll, pTC->pPhrase->doclist.nAll
          );
          if( ii==0 || nCount<nMinEst ) nMinEst = nCount;
        }
      }
    }
    pTC->pToken = 0;
  }

  return rc;
}